

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_DRAIN_MANA(effect_handler_context_t_conflict *context)

{
  byte *pbVar1;
  uint32_t *puVar2;
  anon_enum_32 aVar3;
  player_upkeep *ppVar4;
  player *ppVar5;
  _Bool _Var6;
  wchar_t timer;
  monster *mon;
  loc grid;
  monster_conflict *mon_00;
  short sVar7;
  wchar_t wVar8;
  short sVar9;
  char m_name [80];
  
  timer = effect_calculate_value(context,false);
  aVar3 = (context->origin).what;
  mon = monster_target_monster(context);
  grid = cave_find_decoy(cave);
  context->ident = true;
  if (aVar3 == SRC_TRAP) {
    mon_00 = (monster_conflict *)0x0;
  }
  else {
    if ((context->origin).what != SRC_MONSTER) {
      __assert_fail("context->origin.what == SRC_MONSTER",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                    ,0x3e1,"_Bool effect_handler_DRAIN_MANA(effect_handler_context_t *)");
    }
    mon_00 = (monster_conflict *)cave_monster(cave,(context->origin).which.grid.x);
    monster_desc(m_name,0x50,(monster *)mon_00,L'̔');
  }
  ppVar5 = player;
  if (mon == (monster *)0x0) {
    if (grid.x == L'\0' || (ulong)grid >> 0x20 == 0) {
      wVar8 = (wchar_t)player->csp;
      if (wVar8 == L'\0') {
        msg("The draining fails.");
        if (aVar3 != SRC_TRAP) {
          update_smart_learn(mon_00,player,L'\0',L'\x1d',L'\xffffffff');
        }
      }
      else {
        if (timer < wVar8) {
          sVar7 = player->csp - (short)timer;
          wVar8 = timer;
        }
        else {
          player->csp_frac = 0;
          sVar7 = 0;
        }
        ppVar5->csp = sVar7;
        if (aVar3 != SRC_TRAP) {
          sVar7 = mon_00->maxhp;
          if (mon_00->hp < sVar7) {
            sVar9 = mon_00->hp + (short)wVar8 * 6;
            if (sVar7 <= sVar9) {
              sVar9 = sVar7;
            }
            mon_00->hp = sVar9;
            ppVar4 = ppVar5->upkeep;
            if ((monster_conflict *)ppVar4->health_who == mon_00) {
              pbVar1 = (byte *)((long)&ppVar4->redraw + 1);
              *pbVar1 = *pbVar1 | 2;
            }
            _Var6 = monster_is_visible((monster *)mon_00);
            if (_Var6) {
              msg("%s appears healthier.",m_name);
            }
          }
        }
        puVar2 = &player->upkeep->redraw;
        *puVar2 = *puVar2 | 0x80;
      }
    }
    else {
      square_destroy_decoy(cave,grid);
    }
  }
  else {
    if (timer < L'\x01') {
      timer = L'\0';
    }
    mon_inc_timed(mon,L'\a',timer,L'\0');
  }
  return true;
}

Assistant:

bool effect_handler_DRAIN_MANA(effect_handler_context_t *context)
{
	int drain = effect_calculate_value(context, false);
	bool monster = context->origin.what != SRC_TRAP;
	char m_name[80];
	struct monster *mon = NULL;
	struct monster *t_mon = monster_target_monster(context);
	struct loc decoy = cave_find_decoy(cave);

	context->ident = true;

	if (monster) {
		assert(context->origin.what == SRC_MONSTER);

		mon = cave_monster(cave, context->origin.which.monster);

		/* Get the monster name (or "it") */
		monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
	}

	/* Target is another monster - disenchant it */
	if (t_mon) {
		mon_inc_timed(t_mon, MON_TMD_DISEN, MAX(drain, 0), 0);
		return true;
	}

	/* Target was a decoy - destroy it */
	if (decoy.y && decoy.x) {
		square_destroy_decoy(cave, decoy);
		return true;
	}

	/* The player has no mana */
	if (!player->csp) {
		msg("The draining fails.");
		if (monster) {
			update_smart_learn(mon, player, 0, PF_NO_MANA, -1);
		}
		return true;
	}

	/* Drain the given amount if the player has that much, or all of it */
	if (drain >= player->csp) {
		drain = player->csp;
		player->csp = 0;
		player->csp_frac = 0;
	} else {
		player->csp -= drain;
	}

	/* Heal the monster */
	if (monster) {
		if (mon->hp < mon->maxhp) {
			mon->hp += (6 * drain);
			if (mon->hp > mon->maxhp)
				mon->hp = mon->maxhp;

			/* Redraw (later) if needed */
			if (player->upkeep->health_who == mon)
				player->upkeep->redraw |= (PR_HEALTH);

			/* Special message */
			if (monster_is_visible(mon))
				msg("%s appears healthier.", m_name);
		}
	}

	/* Redraw mana */
	player->upkeep->redraw |= PR_MANA;

	return true;
}